

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O2

void __thiscall RecoveryTest_SigtermTest_Test::TestBody(RecoveryTest_SigtermTest_Test *this)

{
  bool bVar1;
  DeathTest *pDVar2;
  bool bVar3;
  int iVar4;
  char *message;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  ExitedOrKilled local_f8 [4];
  char regex [19];
  RE local_c0;
  
  builtin_strncpy(regex,"posixSignalHandler",0x13);
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) goto LAB_0010c116;
  testing::internal::RE::Init(&local_c0,regex);
  bVar3 = testing::internal::DeathTest::Create
                    ("RaiseSigterm()",&local_c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                     ,0x60,&gtest_dt);
  if (bVar3) {
    if (gtest_dt != (DeathTest *)0x0) {
      gtest_dt_ptr.ptr_ = gtest_dt;
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])();
      pDVar2 = gtest_dt;
      if (iVar4 == 0) {
        extensions::ExitedOrKilled::ExitedOrKilled(local_f8,3,0xf);
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])();
        bVar3 = extensions::ExitedOrKilled::operator()(local_f8,iVar4);
        iVar4 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
        if ((char)iVar4 != '\0') goto LAB_0010c0f1;
        bVar3 = true;
        bVar1 = false;
      }
      else {
        if (iVar4 == 1) {
          gtest_sentinel.test_ = gtest_dt;
          bVar3 = testing::internal::AlwaysTrue();
          if (bVar3) {
            RaiseSigterm();
          }
          (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
        }
LAB_0010c0f1:
        bVar3 = false;
        bVar1 = true;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&gtest_dt_ptr);
      if (!bVar1) goto LAB_0010c107;
    }
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
LAB_0010c107:
  testing::internal::RE::~RE(&local_c0);
  if (!bVar3) {
    return;
  }
LAB_0010c116:
  testing::Message::Message((Message *)&local_c0);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_f8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x60,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_f8,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0);
  return;
}

Assistant:

TEST_F (RecoveryTest, SigtermTest) {
#ifdef _WIN32
    const char regex[] = "::SigtermHandler";
#else
    const char regex[] = "posixSignalHandler";
#endif

    ASSERT_EXIT(RaiseSigterm(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGTERM), regex);
}